

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O1

char * strdup_libc_malloc(char *str)

{
  size_t sVar1;
  void *__dest;
  
  sVar1 = strlen(str);
  __dest = malloc(sVar1 + 1);
  if (__dest != (void *)0x0) {
    memcpy(__dest,str,sVar1 + 1);
  }
  return (char *)0x0;
}

Assistant:

static char *strdup_libc_malloc(const char *str) {
  // |strdup| is not in C until C23, so MSVC triggers deprecation warnings, and
  // glibc and musl gate it on a feature macro. Reimplementing it is easier.
  size_t len = strlen(str);
  char *ret = reinterpret_cast<char *>(malloc(len + 1));
  if (ret != NULL) {
    memcpy(ret, str, len + 1);
  }
  return ret;
}